

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *this)

{
  NullableValue<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}